

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O1

void __thiscall
Assimp::MDLImporter::AddBonesToNodeGraph_3DGS_MDL7
          (MDLImporter *this,IntBone_MDL7 **apcBones,aiNode *pcParent,uint16_t iParentIndex)

{
  uint uVar1;
  uchar *puVar2;
  IntBone_MDL7 *pIVar3;
  long lVar4;
  aiNode **ppaVar5;
  aiNode *this_00;
  uint uVar6;
  IntBone_MDL7 **apcBones_00;
  ulong uVar7;
  uint local_454;
  undefined1 local_430 [1024];
  
  if ((apcBones != (IntBone_MDL7 **)0x0) && (pcParent != (aiNode *)0x0)) {
    puVar2 = this->mBuffer;
    if (*(int *)(puVar2 + 8) != 0) {
      lVar4 = 0;
      do {
        if (apcBones[lVar4]->iParent == (ulong)iParentIndex) {
          pcParent->mNumChildren = pcParent->mNumChildren + 1;
        }
        lVar4 = lVar4 + 1;
      } while ((uint)lVar4 < *(uint *)(puVar2 + 8));
    }
    ppaVar5 = (aiNode **)operator_new__((ulong)pcParent->mNumChildren << 3);
    pcParent->mChildren = ppaVar5;
    if (*(int *)(puVar2 + 8) != 0) {
      apcBones_00 = apcBones + 1;
      uVar6 = 0;
      local_454 = 0;
      do {
        pIVar3 = apcBones_00[-1];
        if (pIVar3->iParent == (ulong)iParentIndex) {
          this_00 = (aiNode *)operator_new(0x478);
          aiNode::aiNode(this_00);
          uVar7 = (ulong)local_454;
          local_454 = local_454 + 1;
          pcParent->mChildren[uVar7] = this_00;
          uVar1 = (pIVar3->super_aiBone).mName.length;
          if (0x3fe < uVar1) {
            uVar1 = 0x3ff;
          }
          uVar7 = (ulong)uVar1;
          memcpy(local_430,(pIVar3->super_aiBone).mName.data,uVar7);
          local_430[uVar7] = 0;
          (this_00->mName).length = uVar1;
          memcpy((this_00->mName).data,local_430,uVar7);
          (this_00->mName).data[uVar7] = '\0';
          AddBonesToNodeGraph_3DGS_MDL7(this,apcBones_00,this_00,(uint16_t)uVar6);
        }
        apcBones_00 = apcBones_00 + 1;
        uVar6 = uVar6 + 1;
      } while (uVar6 < *(uint *)(puVar2 + 8));
    }
    return;
  }
  __assert_fail("__null != apcBones && __null != pcParent",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLLoader.cpp"
                ,0x692,
                "void Assimp::MDLImporter::AddBonesToNodeGraph_3DGS_MDL7(const MDL::IntBone_MDL7 **, aiNode *, uint16_t)"
               );
}

Assistant:

void MDLImporter::AddBonesToNodeGraph_3DGS_MDL7(const MDL::IntBone_MDL7** apcBones,
    aiNode* pcParent,uint16_t iParentIndex)
{
    ai_assert(NULL != apcBones && NULL != pcParent);

    // get a pointer to the header ...
    const MDL::Header_MDL7* const pcHeader = (const MDL::Header_MDL7*)this->mBuffer;

    const MDL::IntBone_MDL7** apcBones2 = apcBones;
    for (uint32_t i = 0; i <  pcHeader->bones_num;++i)  {

        const MDL::IntBone_MDL7* const pcBone = *apcBones2++;
        if (pcBone->iParent == iParentIndex) {
            ++pcParent->mNumChildren;
        }
    }
    pcParent->mChildren = new aiNode*[pcParent->mNumChildren];
    unsigned int qq = 0;
    for (uint32_t i = 0; i <  pcHeader->bones_num;++i)  {

        const MDL::IntBone_MDL7* const pcBone = *apcBones++;
        if (pcBone->iParent != iParentIndex)continue;

        aiNode* pcNode = pcParent->mChildren[qq++] = new aiNode();
        pcNode->mName = aiString( pcBone->mName );

        AddBonesToNodeGraph_3DGS_MDL7(apcBones,pcNode,(uint16_t)i);
    }
}